

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_rectpack.h
# Opt level: O3

int stbrp__skyline_find_min_y(stbrp_context *c,stbrp_node *first,int x0,int width,int *pwaste)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  undefined4 in_register_0000000c;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  
  uVar1 = (ushort)c->width;
  uVar6 = (uint)first;
  if ((int)uVar6 < (int)(uint)uVar1) {
    __assert_fail("first->x <= x0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imstb_rectpack.h"
                  ,0x12f,
                  "int stbrp__skyline_find_min_y(stbrp_context *, stbrp_node *, int, int, int *)");
  }
  if (uVar6 < **(ushort **)&c->align) {
    uVar2 = 0;
    iVar7 = 0;
    if ((int)(uint)uVar1 < (int)(x0 + uVar6)) {
      iVar7 = 0;
      iVar8 = 0;
      uVar2 = 0;
      uVar9 = (uint)uVar1;
      do {
        uVar3 = (uint)*(ushort *)((long)&c->width + 2);
        if (uVar2 < uVar3) {
          iVar4 = (uVar3 - uVar2) * iVar8;
          c = *(stbrp_context **)&c->align;
          uVar1 = (ushort)c->width;
          uVar5 = (uint)uVar1;
          uVar2 = uVar3;
          if ((int)uVar9 < (int)uVar6) {
            iVar10 = uVar1 - uVar6;
          }
          else {
            iVar10 = uVar1 - uVar9;
          }
        }
        else {
          c = *(stbrp_context **)&c->align;
          uVar5 = (uint)(ushort)c->width;
          iVar10 = x0 - iVar8;
          if ((int)((uVar5 - uVar9) + iVar8) <= x0) {
            iVar10 = uVar5 - uVar9;
          }
          iVar4 = (uVar2 - uVar3) * iVar10;
        }
        iVar7 = iVar7 + iVar4;
        iVar8 = iVar8 + iVar10;
        uVar9 = uVar5;
      } while (uVar5 < x0 + uVar6);
    }
    *(int *)CONCAT44(in_register_0000000c,width) = iVar7;
    return uVar2;
  }
  __assert_fail("node->next->x > x0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imstb_rectpack.h"
                ,0x136,
                "int stbrp__skyline_find_min_y(stbrp_context *, stbrp_node *, int, int, int *)");
}

Assistant:

static int stbrp__skyline_find_min_y(stbrp_context *c, stbrp_node *first, int x0, int width, int *pwaste)
{
   stbrp_node *node = first;
   int x1 = x0 + width;
   int min_y, visited_width, waste_area;

   STBRP__NOTUSED(c);

   STBRP_ASSERT(first->x <= x0);

   #if 0
   // skip in case we're past the node
   while (node->next->x <= x0)
      ++node;
   #else
   STBRP_ASSERT(node->next->x > x0); // we ended up handling this in the caller for efficiency
   #endif

   STBRP_ASSERT(node->x <= x0);

   min_y = 0;
   waste_area = 0;
   visited_width = 0;
   while (node->x < x1) {
      if (node->y > min_y) {
         // raise min_y higher.
         // we've accounted for all waste up to min_y,
         // but we'll now add more waste for everything we've visted
         waste_area += visited_width * (node->y - min_y);
         min_y = node->y;
         // the first time through, visited_width might be reduced
         if (node->x < x0)
            visited_width += node->next->x - x0;
         else
            visited_width += node->next->x - node->x;
      } else {
         // add waste area
         int under_width = node->next->x - node->x;
         if (under_width + visited_width > width)
            under_width = width - visited_width;
         waste_area += under_width * (min_y - node->y);
         visited_width += under_width;
      }
      node = node->next;
   }

   *pwaste = waste_area;
   return min_y;
}